

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86::destroy_pipeline(InnerProduct_x86 *this,Option *opt)

{
  undefined8 in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x250) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x250) + 0x28))(*(long **)(in_RDI + 0x250),in_RSI);
    if (*(long **)(in_RDI + 0x250) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x250) + 8))();
    }
    *(undefined8 *)(in_RDI + 0x250) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86::destroy_pipeline(const Option& opt)
{
    if (flatten)
    {
        flatten->destroy_pipeline(opt);
        delete flatten;
        flatten = 0;
    }

    return 0;
}